

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::UnitTestMisbehaving
          (PeerManagerImpl *this,NodeId peer_id)

{
  long lVar1;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff78;
  char *func;
  PeerManagerImpl *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  allocator<char> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *in_stack_ffffffffffffffc0;
  Peer *in_stack_ffffffffffffffc8;
  PeerManagerImpl *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  func = &stack0xffffffffffffffc8;
  this_00 = in_RDI;
  GetPeerRef(in_stack_ffffffffffffff98,(NodeId)in_RDI);
  inline_assertion_check<true,std::shared_ptr<(anonymous_namespace)::Peer>>
            ((shared_ptr<(anonymous_namespace)::Peer> *)in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),func,
             (char *)in_RDI);
  std::__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*(in_stack_ffffffffffffff78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,in_RSI,in_stack_ffffffffffffffa8);
  Misbehaving(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(in_stack_ffffffffffffff68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  std::shared_ptr<(anonymous_namespace)::Peer>::~shared_ptr
            ((shared_ptr<(anonymous_namespace)::Peer> *)in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_peer_mutex) { Misbehaving(*Assert(GetPeerRef(peer_id)), ""); }